

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int recv_with_timeout(amqp_connection_state_t state,uint64_t start,timeval *timeout)

{
  amqp_boolean_t aVar1;
  int *piVar2;
  amqp_socket_t *paVar3;
  ulong uVar4;
  ssize_t sVar5;
  uint64_t uVar6;
  ulong *in_RDX;
  long in_RSI;
  amqp_connection_state_t in_RDI;
  uint64_t current_time;
  uint64_t current_timestamp;
  uint64_t time_left;
  uint64_t end_timestamp;
  int timeout_ms;
  pollfd pfd;
  int fd;
  int res;
  int in_stack_ffffffffffffff9c;
  amqp_connection_state_t in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  amqp_socket_t *in_stack_ffffffffffffffb0;
  pollfd local_30;
  int local_28;
  int local_24;
  ulong *local_20;
  long local_18;
  amqp_connection_state_t local_10;
  int local_4;
  
  local_10 = in_RDI;
  if (in_RDX != (ulong *)0x0) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_28 = amqp_get_sockfd(in_stack_ffffffffffffffa0);
    if (local_28 == -1) {
      return -7;
    }
    if (0x7fffffff < *local_20 * 1000 + local_20[1] / 1000) {
      return -10;
    }
    while( true ) {
      local_30.fd = local_28;
      local_30.events = 1;
      local_30.revents = 0;
      in_stack_ffffffffffffffa0 = (amqp_connection_state_t)(*local_20 * 1000);
      local_24 = poll(&local_30,1,(int)in_stack_ffffffffffffffa0 + (int)((long)local_20[1] / 1000));
      if (0 < local_24) break;
      if (local_24 == 0) {
        return -0xd;
      }
      if (local_24 == -1) {
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          return -9;
        }
        if (local_20 != (ulong *)0x0) {
          in_stack_ffffffffffffffb0 = (amqp_socket_t *)amqp_get_monotonic_timestamp();
          if (in_stack_ffffffffffffffb0 == (amqp_socket_t *)0x0) {
            return -0xe;
          }
          paVar3 = (amqp_socket_t *)(local_18 + *local_20 * 1000000000 + local_20[1] * 1000);
          if (paVar3 < in_stack_ffffffffffffffb0) {
            return -0xd;
          }
          uVar4 = (long)paVar3 - (long)in_stack_ffffffffffffffb0;
          *local_20 = uVar4 / 1000000000;
          local_20[1] = (uVar4 % 1000000000) / 1000;
        }
      }
    }
  }
  sVar5 = amqp_socket_recv(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           (size_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  local_24 = (int)sVar5;
  local_4 = local_24;
  if (-1 < local_24) {
    local_10->sock_inbound_limit = (long)local_24;
    local_10->sock_inbound_offset = 0;
    aVar1 = amqp_heartbeat_enabled(local_10);
    if (aVar1 != 0) {
      uVar6 = amqp_get_monotonic_timestamp();
      if (uVar6 == 0) {
        return -0xe;
      }
      uVar6 = amqp_calc_next_recv_heartbeat(local_10,uVar6);
      local_10->next_recv_heartbeat = uVar6;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int recv_with_timeout(amqp_connection_state_t state, uint64_t start, struct timeval *timeout)
{
  int res;

  if (timeout) {
    int fd;

    fd = amqp_get_sockfd(state);
    if (-1 == fd) {
      return AMQP_STATUS_CONNECTION_CLOSED;
    }

    if (INT_MAX < (uint64_t)timeout->tv_sec * AMQP_MS_PER_S +
        (uint64_t)timeout->tv_usec / AMQP_US_PER_MS) {
      return AMQP_STATUS_INVALID_PARAMETER;
    }

    while (1) {
      struct pollfd pfd;
      int timeout_ms;

      pfd.fd = fd;
      pfd.events = POLLIN;
      pfd.revents = 0;

      timeout_ms = timeout->tv_sec * AMQP_MS_PER_S +
          timeout->tv_usec / AMQP_US_PER_MS;

      res = poll(&pfd, 1, timeout_ms);

      if (0 < res) {
        break;
      } else if (0 == res) {
        return AMQP_STATUS_TIMEOUT;
      } else if (-1 == res) {
        if (EINTR == errno) {
          if (timeout) {
            uint64_t end_timestamp;
            uint64_t time_left;
            uint64_t current_timestamp = amqp_get_monotonic_timestamp();
            if (0 == current_timestamp) {
              return AMQP_STATUS_TIMER_FAILURE;
            }
            end_timestamp = start +
              (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
              (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;
            if (current_timestamp > end_timestamp) {
              return AMQP_STATUS_TIMEOUT;
            }

            time_left = end_timestamp - current_timestamp;

            timeout->tv_sec = time_left / AMQP_NS_PER_S;
            timeout->tv_usec = (time_left % AMQP_NS_PER_S) / AMQP_NS_PER_US;
          }
          continue;
        }
        return AMQP_STATUS_SOCKET_ERROR;
      }
    }
  }

  res = amqp_socket_recv(state->socket, state->sock_inbound_buffer.bytes,
                         state->sock_inbound_buffer.len, 0);

  if (res < 0) {
    return res;
  }

  state->sock_inbound_limit = res;
  state->sock_inbound_offset = 0;

  if (amqp_heartbeat_enabled(state)) {
    uint64_t current_time = amqp_get_monotonic_timestamp();
    if (0 == current_time) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
    state->next_recv_heartbeat = amqp_calc_next_recv_heartbeat(state, current_time);
  }

  return AMQP_STATUS_OK;
}